

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O0

void __thiscall
ROM::Request::Node::visit
          (Node *this,function<void_(ROM::Request::ListType,_unsigned_long)> *enter_list,
          function<void_()> *exit_list,
          function<void_(ROM::Request::ListType,_const_ROM::Description_&,_bool,_unsigned_long)>
          *add_item)

{
  bool bVar1;
  value_type *pvVar2;
  function<void_(ROM::Request::ListType,_const_ROM::Description_&,_bool,_unsigned_long)> *pfVar3;
  ListType LVar4;
  size_type sVar5;
  value_type *pvVar6;
  Description local_178;
  const_reference local_e0;
  value_type *child;
  size_t index;
  ListType list_type;
  Description local_c0;
  function<void_(ROM::Request::ListType,_const_ROM::Description_&,_bool,_unsigned_long)> *local_28;
  function<void_(ROM::Request::ListType,_const_ROM::Description_&,_bool,_unsigned_long)>
  *add_item_local;
  function<void_()> *exit_list_local;
  function<void_(ROM::Request::ListType,_unsigned_long)> *enter_list_local;
  Node *this_local;
  
  local_28 = add_item;
  add_item_local =
       (function<void_(ROM::Request::ListType,_const_ROM::Description_&,_bool,_unsigned_long)> *)
       exit_list;
  exit_list_local = (function<void_()> *)enter_list;
  enter_list_local = (function<void_(ROM::Request::ListType,_unsigned_long)> *)this;
  if (this->type < One) {
    LVar4 = (ListType)(this->type != Any);
    index._0_4_ = LVar4;
    sVar5 = std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::size
                      (&this->children);
    std::function<void_(ROM::Request::ListType,_unsigned_long)>::operator()(enter_list,LVar4,sVar5);
    for (child = (value_type *)0x0; pvVar2 = child,
        pvVar6 = (value_type *)
                 std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::size
                           (&this->children), pvVar2 < pvVar6;
        child = (value_type *)((long)&child->type + 1)) {
      local_e0 = std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::operator[]
                           (&this->children,(size_type)child);
      pfVar3 = local_28;
      LVar4 = (ListType)index;
      if (local_e0->type == One) {
        Description::Description(&local_178,local_e0->name);
        bVar1 = local_e0->is_optional;
        sVar5 = std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::size
                          (&this->children);
        std::function<void_(ROM::Request::ListType,_const_ROM::Description_&,_bool,_unsigned_long)>
        ::operator()(pfVar3,LVar4,&local_178,(bool)(bVar1 & 1),~(ulong)child + sVar5);
        Description::~Description(&local_178);
      }
      else {
        visit(local_e0,(function<void_(ROM::Request::ListType,_unsigned_long)> *)exit_list_local,
              (function<void_()> *)add_item_local,local_28);
      }
    }
    std::function<void_()>::operator()((function<void_()> *)add_item_local);
  }
  else if (this->type == One) {
    std::function<void_(ROM::Request::ListType,_unsigned_long)>::operator()(enter_list,Single,1);
    pfVar3 = local_28;
    Description::Description(&local_c0,this->name);
    std::function<void_(ROM::Request::ListType,_const_ROM::Description_&,_bool,_unsigned_long)>::
    operator()(pfVar3,Any,&local_c0,(bool)(this->is_optional & 1),0);
    Description::~Description(&local_c0);
    std::function<void_()>::operator()((function<void_()> *)add_item_local);
  }
  return;
}

Assistant:

void Request::Node::visit(
	const std::function<void(ListType, size_t)> &enter_list,
	const std::function<void(void)> &exit_list,
	const std::function<void(ROM::Request::ListType type, const ROM::Description &, bool is_optional, size_t remaining)> &add_item
) const {
	switch(type) {
		case Type::One:
			enter_list(ListType::Single, 1);
			add_item(ROM::Request::ListType::Any, Description(name), is_optional, 0);
			exit_list();
		break;

		case Type::Any:
		case Type::All: {
			const ListType list_type = type == Type::Any ? ListType::Any : ListType::All;
			enter_list(list_type, children.size());
			for(size_t index = 0; index < children.size(); index++) {
				auto &child = children[index];

				if(child.type == Type::One) {
					add_item(list_type, Description(child.name), child.is_optional, children.size() - 1 - index);
				} else {
					child.visit(enter_list, exit_list, add_item);
				}
			}
			exit_list();
		} break;
	}
}